

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O2

void __thiscall eglu::anon_unknown_1::RenderContext::destroy(RenderContext *this)

{
  DynamicLibrary *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long *plVar3;
  
  if (this->m_eglDisplay != (EGLDisplay)0x0) {
    iVar1 = (*this->m_display->_vptr_NativeDisplay[2])();
    plVar3 = (long *)CONCAT44(extraout_var,iVar1);
    (**(code **)(*plVar3 + 0x138))(plVar3,this->m_eglDisplay,0,0,0);
    dVar2 = (**(code **)(*plVar3 + 0xf8))(plVar3);
    checkError(dVar2,"makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x1d4);
    if (this->m_eglSurface != (EGLSurface)0x0) {
      (**(code **)(*plVar3 + 0xb0))(plVar3,this->m_eglDisplay);
      dVar2 = (**(code **)(*plVar3 + 0xf8))(plVar3);
      checkError(dVar2,"destroySurface(m_eglDisplay, m_eglSurface)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x1d7);
    }
    if (this->m_eglContext != (EGLContext)0x0) {
      (**(code **)(*plVar3 + 0x98))(plVar3,this->m_eglDisplay);
      dVar2 = (**(code **)(*plVar3 + 0xf8))(plVar3);
      checkError(dVar2,"destroyContext(m_eglDisplay, m_eglContext)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x1da);
    }
    (**(code **)(*plVar3 + 0x1a0))(plVar3,this->m_eglDisplay);
    dVar2 = (**(code **)(*plVar3 + 0xf8))(plVar3);
    checkError(dVar2,"terminate(m_eglDisplay)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x1dc);
    this->m_eglDisplay = (EGLDisplay)0x0;
    this->m_eglSurface = (EGLSurface)0x0;
    this->m_eglContext = (EGLContext)0x0;
  }
  if (this->m_window != (NativeWindow *)0x0) {
    (*this->m_window->_vptr_NativeWindow[1])();
  }
  if (this->m_pixmap != (NativePixmap *)0x0) {
    (**(code **)(*(long *)this->m_pixmap + 8))();
  }
  if (this->m_display != (NativeDisplay *)0x0) {
    (*this->m_display->_vptr_NativeDisplay[1])();
  }
  this_00 = this->m_dynamicGLLibrary;
  if (this_00 != (DynamicLibrary *)0x0) {
    de::DynamicLibrary::~DynamicLibrary(this_00);
  }
  operator_delete(this_00,8);
  this->m_dynamicGLLibrary = (DynamicLibrary *)0x0;
  this->m_display = (NativeDisplay *)0x0;
  this->m_window = (NativeWindow *)0x0;
  this->m_pixmap = (NativePixmap *)0x0;
  return;
}

Assistant:

void RenderContext::destroy (void)
{
	if (m_eglDisplay != EGL_NO_DISPLAY)
	{
		const Library& egl = m_display->getLibrary();

		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		if (m_eglSurface != EGL_NO_SURFACE)
			EGLU_CHECK_CALL(egl, destroySurface(m_eglDisplay, m_eglSurface));

		if (m_eglContext != EGL_NO_CONTEXT)
			EGLU_CHECK_CALL(egl, destroyContext(m_eglDisplay, m_eglContext));

		EGLU_CHECK_CALL(egl, terminate(m_eglDisplay));

		m_eglDisplay	= EGL_NO_DISPLAY;
		m_eglSurface	= EGL_NO_SURFACE;
		m_eglContext	= EGL_NO_CONTEXT;
	}

	delete m_window;
	delete m_pixmap;
	delete m_display;
	delete m_dynamicGLLibrary;

	m_window			= DE_NULL;
	m_pixmap			= DE_NULL;
	m_display			= DE_NULL;
	m_dynamicGLLibrary	= DE_NULL;
}